

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conformance.cc
# Opt level: O0

void anon_unknown.dwarf_442e::require_conform(string *expected,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Expression_lhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  EVar1;
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  Enum local_230;
  ExpressionDecomposer local_224;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  Enum local_218;
  Result local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  Enum local_1e8;
  ExpressionDecomposer local_1dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  Enum local_1d0;
  Result local_1c8;
  undefined1 local_1a8 [8];
  va_list args_1;
  undefined1 local_188 [8];
  string npf_result;
  undefined4 local_158;
  undefined4 local_154;
  va_list args;
  undefined1 local_138 [8];
  string sys_printf_result;
  char buf [256];
  char *fmt_local;
  string *expected_local;
  
  if (in_AL != '\0') {
    local_2b8 = in_XMM0_Qa;
    local_2a8 = in_XMM1_Qa;
    local_298 = in_XMM2_Qa;
    local_288 = in_XMM3_Qa;
    local_278 = in_XMM4_Qa;
    local_268 = in_XMM5_Qa;
    local_258 = in_XMM6_Qa;
    local_248 = in_XMM7_Qa;
  }
  local_2d8 = in_RDX;
  local_2d0 = in_RCX;
  local_2c8 = in_R8;
  local_2c0 = in_R9;
  std::__cxx11::string::string((string *)local_138);
  args[0].overflow_arg_area = local_2e8;
  args[0]._0_8_ = &stack0x00000008;
  local_154 = 0x30;
  local_158 = 0x10;
  vsnprintf(sys_printf_result.field_2._M_local_buf + 8,0x100,fmt,&local_158);
  std::__cxx11::string::operator=((string *)local_138,sys_printf_result.field_2._M_local_buf + 8);
  std::__cxx11::string::string((string *)local_188);
  args_1[0].overflow_arg_area = local_2e8;
  args_1[0]._0_8_ = &stack0x00000008;
  local_1a8._4_4_ = 0x30;
  local_1a8._0_4_ = 0x10;
  npf_vsnprintf(sys_printf_result.field_2._M_local_buf + 8,0x100,fmt,(__va_list_tag *)local_1a8);
  std::__cxx11::string::operator=((string *)local_188,sys_printf_result.field_2._M_local_buf + 8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1dc,DT_REQUIRE);
  EVar1 = doctest::detail::ExpressionDecomposer::operator<<
                    (&local_1dc,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
  ;
  local_1f0 = EVar1.lhs;
  local_1e8 = EVar1.m_at;
  local_1d8 = local_1f0;
  local_1d0 = local_1e8;
  doctest::detail::Expression_lhs<std::__cxx11::string&>::operator==
            (&local_1c8,(Expression_lhs<std::__cxx11::string&> *)&local_1d8,expected);
  doctest::detail::decomp_assert
            (DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/charlesnicholson[P]nanoprintf/tests/conformance.cc"
             ,0x3b,"sys_printf_result == expected",&local_1c8);
  doctest::detail::Result::~Result(&local_1c8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_224,DT_REQUIRE);
  EVar1 = doctest::detail::ExpressionDecomposer::operator<<
                    (&local_224,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188)
  ;
  local_238 = EVar1.lhs;
  local_230 = EVar1.m_at;
  local_220 = local_238;
  local_218 = local_230;
  doctest::detail::Expression_lhs<std::__cxx11::string&>::operator==
            (&local_210,(Expression_lhs<std::__cxx11::string&> *)&local_220,expected);
  doctest::detail::decomp_assert
            (DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/charlesnicholson[P]nanoprintf/tests/conformance.cc"
             ,0x3c,"npf_result == expected",&local_210);
  doctest::detail::Result::~Result(&local_210);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_138);
  return;
}

Assistant:

void require_conform(const std::string& expected, char const *fmt, ...) {
  char buf[256];

  std::string sys_printf_result; {
    va_list args;
    va_start(args, fmt);
    vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);
    buf[sizeof(buf)-1] = '\0';
    sys_printf_result = buf;
  }

  std::string npf_result; {
    va_list args;
    va_start(args, fmt);
    npf_vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);
    buf[sizeof(buf)-1] = '\0';
    npf_result = buf;
  }

  REQUIRE(sys_printf_result == expected);
  REQUIRE(npf_result == expected);
}